

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcRamp::~IfcRamp(IfcRamp *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x839c70;
  *(undefined8 *)&this->field_0x178 = 0x839d88;
  *(undefined8 *)&this->field_0x88 = 0x839c98;
  *(undefined8 *)&this->field_0x98 = 0x839cc0;
  *(undefined8 *)&this->field_0xd0 = 0x839ce8;
  *(undefined8 *)&this->field_0x100 = 0x839d10;
  *(undefined8 *)&this->field_0x138 = 0x839d38;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x839d60;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRamp,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00839da8);
  operator_delete(this,400);
  return;
}

Assistant:

IfcRamp() : Object("IfcRamp") {}